

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

void __thiscall Compiler::visit(Compiler *this,FloatLit *node)

{
  pointer *ppuVar1;
  iterator __position;
  long lVar2;
  value_type_conflict1 val;
  uchar local_2a [2];
  double local_28;
  
  local_28 = node->m_value;
  local_2a[1] = 10;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->m_buffer,local_2a + 1);
  lVar2 = 0;
  do {
    local_2a[0] = *(uchar *)((long)&local_28 + lVar2);
    __position._M_current =
         (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_buffer,__position,
                 local_2a);
    }
    else {
      *__position._M_current = local_2a[0];
      ppuVar1 = &(this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  return;
}

Assistant:

void Compiler::visit(AST::FloatLit *node) {
    std::array<Bytecode, sizeof(double)> tmp = {};
    memcpy(tmp.data(), &node->m_value, sizeof(double));
    m_buffer.push_back(Opcode::DCONST);
    for (auto val : tmp) {
        m_buffer.push_back(val);
    }
}